

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O2

Factor * __thiscall libDAI::HAK::belief(Factor *__return_storage_ptr__,HAK *this,VarSet *ns)

{
  bool bVar1;
  pointer pTVar2;
  pointer this_00;
  
  this_00 = (this->_Qb).
            super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    pTVar2 = this_00;
    if (this_00 ==
        (this->_Qb).
        super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
LAB_004e3458:
      if (this_00 == pTVar2) {
        this_00 = (this->_Qa).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        while ((this_00 !=
                (this->_Qa).
                super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish &&
               (bVar1 = VarSet::includes(&this_00->_vs,ns), !bVar1))) {
          this_00 = this_00 + 1;
        }
      }
      TFactor<double>::marginal(__return_storage_ptr__,this_00,ns,true);
      return __return_storage_ptr__;
    }
    bVar1 = VarSet::includes(&this_00->_vs,ns);
    if (bVar1) {
      pTVar2 = (this->_Qb).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_004e3458;
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

Factor HAK::belief( const VarSet &ns ) const {
        vector<Factor>::const_iterator beta;
        for( beta = _Qb.begin(); beta != _Qb.end(); beta++ )
            if( beta->vars() >> ns )
                break;
        if( beta != _Qb.end() )
            return( beta->marginal(ns) );
        else {
            vector<Factor>::const_iterator alpha;
            for( alpha = _Qa.begin(); alpha != _Qa.end(); alpha++ )
                if( alpha->vars() >> ns )
                    break;
            assert( alpha != _Qa.end() );
            return( alpha->marginal(ns) );
        }
    }